

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perceptron.cpp
# Opt level: O0

void __thiscall Perceptron::~Perceptron(Perceptron *this)

{
  Perceptron *this_local;
  
  std::__cxx11::string::~string((string *)&this->m_label);
  std::function<double_(double)>::~function(&this->m_activation);
  return;
}

Assistant:

Perceptron::~Perceptron(){}